

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::swap_dhl(SM83 *this)

{
  byte bVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  unsigned_short *in_stack_ffffffffffffffc8;
  u8 result;
  u8 high;
  u8 low;
  u8 value;
  SM83 *this_local;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x47;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  SWAP (HL)\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,in_stack_ffffffffffffffc8);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  bVar1 = bVar1 << 4 | (byte)((int)(bVar1 & 0xf0) >> 4);
  Bus::Write8(this->bus,(this->field_3).hl,bVar1,true);
  SetZeroFlag(this,bVar1 == 0);
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,false);
  SetCarryFlag(this,false);
  return;
}

Assistant:

void SM83::swap_dhl() {
    LTRACE("SWAP (HL)");

    u8 value = bus.Read8(hl);
    u8 low = value & 0x0F;
    u8 high = (value & 0xF0) >> 4;

    u8 result = static_cast<u8>((low << 4) | high);

    bus.Write8(hl, result);

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(false);
}